

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O2

StringTree * capnp::compiler::expressionStringTree(Reader exp)

{
  byte bVar1;
  ushort uVar2;
  undefined8 uVar3;
  Reader exp_00;
  Reader params;
  Reader params_00;
  Reader exp_01;
  Reader RVar4;
  StringTree *params_1;
  char (*in_RDX) [14];
  size_t sVar5;
  StringTree *in_RDI;
  Reader *in_R8;
  char *in_R9;
  ulong count;
  undefined4 uVar6;
  undefined4 uVar7;
  StringPtr chars;
  StringPtr chars_00;
  StringPtr chars_01;
  StringPtr delim;
  Reader RVar8;
  Reader RVar9;
  ArrayBuilder<kj::StringTree> parts;
  Vector<char> escaped;
  undefined1 local_178 [16];
  Reader list;
  Reader app;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  RVar4._reader = exp._reader;
  params_1 = (StringTree *)(ulong)exp._reader.dataSize;
  if (exp._reader.dataSize < 0x10) {
switchD_00137164_caseD_0:
    kj::strTree<char_const(&)[14]>(in_RDI,(kj *)"<parse error>",in_RDX);
    return in_RDI;
  }
  uVar2 = *exp._reader.data;
  if (0xd < (ulong)uVar2) {
    kj::_::unreachable();
  }
  in_RDX = (char (*) [14])
           ((long)&switchD_00137164::switchdataD_001a8890 +
           (long)(int)(&switchD_00137164::switchdataD_001a8890)[uVar2]);
  uVar3 = exp._reader._32_8_;
  switch(uVar2) {
  case 0:
    goto switchD_00137164_caseD_0;
  case 1:
    if (exp._reader.dataSize < 0x80) {
      escaped.builder.ptr = (char *)0x0;
    }
    else {
      escaped.builder.ptr = *(char **)((long)exp._reader.data + 8);
    }
    kj::strTree<unsigned_long>(in_RDI,(unsigned_long *)&escaped);
    break;
  case 2:
    list.reader.segment._0_1_ = 0x2d;
    if (exp._reader.dataSize < 0x80) {
      escaped.builder.ptr = (char *)0x0;
    }
    else {
      escaped.builder.ptr = *(char **)((long)exp._reader.data + 8);
    }
    kj::strTree<char,unsigned_long>(in_RDI,(kj *)&list,(char *)&escaped,(unsigned_long *)params_1);
    break;
  case 3:
    uVar6 = 0;
    uVar7 = 0;
    if (0x7f < exp._reader.dataSize) {
      uVar6 = (undefined4)*(undefined8 *)((long)exp._reader.data + 8);
      uVar7 = (undefined4)((ulong)*(undefined8 *)((long)exp._reader.data + 8) >> 0x20);
    }
    escaped.builder.ptr = (char *)CONCAT44(uVar7,uVar6);
    kj::strTree<double>(in_RDI,(double *)&escaped);
    break;
  case 4:
    RVar8 = Expression::Reader::getString(&exp);
    chars.content.ptr = RVar8.super_StringPtr.content.size_;
    chars.content.size_ = (size_t)params_1;
    stringLiteralStringTree(in_RDI,RVar8.super_StringPtr.content.ptr,chars);
    break;
  case 5:
    Expression::Reader::getRelativeName((Reader *)&escaped,&exp);
    list.reader._0_16_ = LocatedText::Reader::getValue((Reader *)&escaped);
    kj::strTree<capnp::Text::Reader>(in_RDI,(kj *)&list,list.reader.capTable);
    break;
  case 6:
    Expression::Reader::getList(&list,&exp);
    count = list.reader._24_8_ & 0xffffffff;
    parts.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(count);
    parts.endPtr = parts.ptr + count;
    parts.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_178._0_8_ = &list;
    parts.pos = parts.ptr;
    for (local_178._8_4_ = 0; local_178._8_4_ != list.reader.elementCount;
        local_178._8_4_ = local_178._8_4_ + 1) {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
      ::operator*((Reader *)&app,
                  (IndexingIterator<const_capnp::List<capnp::compiler::Expression,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Reader>
                   *)local_178);
      exp_01._reader.capTable = app._reader.capTable;
      exp_01._reader.segment = app._reader.segment;
      exp_01._reader.data = app._reader.data;
      exp_01._reader.pointers = app._reader.pointers;
      exp_01._reader.dataSize = app._reader.dataSize;
      exp_01._reader.pointerCount = app._reader.pointerCount;
      exp_01._reader._38_2_ = app._reader._38_2_;
      exp_01._reader.nestingLimit = app._reader.nestingLimit;
      exp_01._reader._44_4_ = app._reader._44_4_;
      expressionStringTree(exp_01);
      kj::StringTree::StringTree(parts.pos,(StringTree *)&escaped);
      parts.pos = parts.pos + 1;
      kj::StringTree::~StringTree((StringTree *)&escaped);
    }
    app._reader.capTable = (CapTableReader *)(((long)parts.pos - (long)parts.ptr) / 0x38);
    app._reader.segment = (SegmentReader *)parts.ptr;
    app._reader.data = parts.disposer;
    parts._0_16_ = ZEXT816(0);
    parts.endPtr = (StringTree *)0x0;
    delim.content.size_ = 3;
    delim.content.ptr = ", ";
    kj::StringTree::StringTree((StringTree *)&escaped,(Array<kj::StringTree> *)&app,delim);
    kj::strTree<char_const(&)[3],kj::StringTree,char_const(&)[3]>
              (in_RDI,(kj *)"[ ",(char (*) [3])&escaped,(StringTree *)" ]",(char (*) [3])in_R8);
    kj::StringTree::~StringTree((StringTree *)&escaped);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&app);
    kj::ArrayBuilder<kj::StringTree>::dispose(&parts);
    break;
  case 7:
    Expression::Reader::getTuple(&local_60,&exp);
    params_00.reader.capTable = local_60.reader.capTable;
    params_00.reader.segment = local_60.reader.segment;
    params_00.reader.ptr = local_60.reader.ptr;
    params_00.reader.elementCount = local_60.reader.elementCount;
    params_00.reader.step = local_60.reader.step;
    params_00.reader.structDataSize = local_60.reader.structDataSize;
    params_00.reader.structPointerCount = local_60.reader.structPointerCount;
    params_00.reader.elementSize = local_60.reader.elementSize;
    params_00.reader._39_1_ = local_60.reader._39_1_;
    params_00.reader.nestingLimit = local_60.reader.nestingLimit;
    params_00.reader._44_4_ = local_60.reader._44_4_;
    tupleLiteral(params_00);
    break;
  case 8:
    RVar9 = Expression::Reader::getBinary(&exp);
    sVar5 = RVar9.super_ArrayPtr<const_unsigned_char>.size_ * 3;
    escaped.builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<char>(sVar5);
    escaped.builder.endPtr = escaped.builder.ptr + sVar5;
    escaped.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    escaped.builder.pos = escaped.builder.ptr;
    for (sVar5 = 0; RVar9.super_ArrayPtr<const_unsigned_char>.size_ != sVar5; sVar5 = sVar5 + 1) {
      bVar1 = RVar9.super_ArrayPtr<const_unsigned_char>.ptr[sVar5];
      kj::Vector<char>::add<char_const&>(&escaped,"0123456789abcdef" + (bVar1 & 0xf));
      kj::Vector<char>::add<char_const&>(&escaped,"0123456789abcdef" + (bVar1 >> 4));
      list.reader.segment._0_1_ = 0x20;
      kj::Vector<char>::add<char>(&escaped,(char *)&list);
    }
    escaped.builder.pos = escaped.builder.pos + -1;
    list.reader.segment._0_1_ = 0x22;
    kj::strTree<char_const(&)[4],kj::Vector<char>&,char>
              (in_RDI,(kj *)"0x\"",(char (*) [4])&escaped,(Vector<char> *)&list,(char *)in_R8);
    kj::ArrayBuilder<char>::dispose(&escaped.builder);
    break;
  case 9:
    app._reader.nestingLimit = exp._reader.nestingLimit;
    app._reader._44_4_ = exp._reader._44_4_;
    app._reader.data = exp._reader.data;
    app._reader.pointers = exp._reader.pointers;
    app._reader.segment = exp._reader.segment;
    app._reader.capTable = exp._reader.capTable;
    app._reader._32_8_ = uVar3;
    Expression::Application::Reader::getFunction(&local_90,&app);
    exp_00._reader.capTable = local_90._reader.capTable;
    exp_00._reader.segment = local_90._reader.segment;
    exp_00._reader.data = local_90._reader.data;
    exp_00._reader.pointers = local_90._reader.pointers;
    exp_00._reader.dataSize = local_90._reader.dataSize;
    exp_00._reader.pointerCount = local_90._reader.pointerCount;
    exp_00._reader._38_2_ = local_90._reader._38_2_;
    exp_00._reader.nestingLimit = local_90._reader.nestingLimit;
    exp_00._reader._44_4_ = local_90._reader._44_4_;
    expressionStringTree(exp_00);
    parts.ptr._0_1_ = 0x28;
    Expression::Application::Reader::getParams(&local_f0,&app);
    params.reader.capTable = local_f0.reader.capTable;
    params.reader.segment = local_f0.reader.segment;
    params.reader.ptr = local_f0.reader.ptr;
    params.reader.elementCount = local_f0.reader.elementCount;
    params.reader.step = local_f0.reader.step;
    params.reader.structDataSize = local_f0.reader.structDataSize;
    params.reader.structPointerCount = local_f0.reader.structPointerCount;
    params.reader.elementSize = local_f0.reader.elementSize;
    params.reader._39_1_ = local_f0.reader._39_1_;
    params.reader.nestingLimit = local_f0.reader.nestingLimit;
    params.reader._44_4_ = local_f0.reader._44_4_;
    tupleLiteral(params);
    local_178[0] = 0x29;
    kj::strTree<kj::StringTree,char,kj::StringTree,char>
              (in_RDI,(kj *)&escaped,(StringTree *)&parts,(char *)&list,(StringTree *)local_178,
               in_R9);
    kj::StringTree::~StringTree((StringTree *)&list);
    goto LAB_00137546;
  case 10:
    list.reader.nestingLimit = exp._reader.nestingLimit;
    list.reader._44_4_ = exp._reader._44_4_;
    list.reader.ptr = (byte *)exp._reader.data;
    list.reader._24_8_ = exp._reader.pointers;
    list.reader._0_16_ = RVar4._reader._0_16_;
    list.reader._32_8_ = uVar3;
    Expression::Member::Reader::getParent(&local_c0,(Reader *)&list);
    RVar4._reader.capTable = local_c0._reader.capTable;
    RVar4._reader.segment = local_c0._reader.segment;
    RVar4._reader.data = local_c0._reader.data;
    RVar4._reader.pointers = local_c0._reader.pointers;
    RVar4._reader.dataSize = local_c0._reader.dataSize;
    RVar4._reader.pointerCount = local_c0._reader.pointerCount;
    RVar4._reader._38_2_ = local_c0._reader._38_2_;
    RVar4._reader.nestingLimit = local_c0._reader.nestingLimit;
    RVar4._reader._44_4_ = local_c0._reader._44_4_;
    expressionStringTree(RVar4);
    local_178[0] = 0x2e;
    Expression::Member::Reader::getName((Reader *)&app,(Reader *)&list);
    parts._0_16_ = LocatedText::Reader::getValue((Reader *)&app);
    kj::strTree<kj::StringTree,char,capnp::Text::Reader>
              (in_RDI,(kj *)&escaped,(StringTree *)local_178,(char *)&parts,in_R8);
    goto LAB_00137546;
  case 0xb:
    app._reader.segment = (SegmentReader *)CONCAT71(app._reader.segment._1_7_,0x2e);
    Expression::Reader::getAbsoluteName((Reader *)&escaped,&exp);
    list.reader._0_16_ = LocatedText::Reader::getValue((Reader *)&escaped);
    kj::strTree<char,capnp::Text::Reader>(in_RDI,(kj *)&app,(char *)&list,(Reader *)&list);
    break;
  case 0xc:
    Expression::Reader::getImport((Reader *)&list,&exp);
    RVar8 = LocatedText::Reader::getValue((Reader *)&list);
    chars_00.content.ptr = RVar8.super_StringPtr.content.size_;
    chars_00.content.size_ = (size_t)params_1;
    stringLiteralStringTree((StringTree *)&escaped,RVar8.super_StringPtr.content.ptr,chars_00);
    kj::strTree<char_const(&)[8],kj::StringTree>
              (in_RDI,(kj *)"import ",(char (*) [8])&escaped,params_1);
    goto LAB_00137546;
  case 0xd:
    Expression::Reader::getEmbed((Reader *)&list,&exp);
    RVar8 = LocatedText::Reader::getValue((Reader *)&list);
    chars_01.content.ptr = RVar8.super_StringPtr.content.size_;
    chars_01.content.size_ = (size_t)params_1;
    stringLiteralStringTree((StringTree *)&escaped,RVar8.super_StringPtr.content.ptr,chars_01);
    kj::strTree<char_const(&)[7],kj::StringTree>
              (in_RDI,(kj *)"embed ",(char (*) [7])&escaped,params_1);
LAB_00137546:
    kj::StringTree::~StringTree((StringTree *)&escaped);
  }
  return in_RDI;
}

Assistant:

static kj::StringTree expressionStringTree(Expression::Reader exp) {
  switch (exp.which()) {
    case Expression::UNKNOWN:
      return kj::strTree("<parse error>");
    case Expression::POSITIVE_INT:
      return kj::strTree(exp.getPositiveInt());
    case Expression::NEGATIVE_INT:
      return kj::strTree('-', exp.getNegativeInt());
    case Expression::FLOAT:
      return kj::strTree(exp.getFloat());
    case Expression::STRING:
      return stringLiteralStringTree(exp.getString());
    case Expression::BINARY:
      return binaryLiteralStringTree(exp.getBinary());
    case Expression::RELATIVE_NAME:
      return kj::strTree(exp.getRelativeName().getValue());
    case Expression::ABSOLUTE_NAME:
      return kj::strTree('.', exp.getAbsoluteName().getValue());
    case Expression::IMPORT:
      return kj::strTree("import ", stringLiteralStringTree(exp.getImport().getValue()));
    case Expression::EMBED:
      return kj::strTree("embed ", stringLiteralStringTree(exp.getEmbed().getValue()));

    case Expression::LIST: {
      auto list = exp.getList();
      auto parts = kj::heapArrayBuilder<kj::StringTree>(list.size());
      for (auto element: list) {
        parts.add(expressionStringTree(element));
      }
      return kj::strTree("[ ", kj::StringTree(parts.finish(), ", "), " ]");
    }

    case Expression::TUPLE:
      return tupleLiteral(exp.getTuple());

    case Expression::APPLICATION: {
      auto app = exp.getApplication();
      return kj::strTree(expressionStringTree(app.getFunction()),
                         '(', tupleLiteral(app.getParams()), ')');
    }

    case Expression::MEMBER: {
      auto member = exp.getMember();
      return kj::strTree(expressionStringTree(member.getParent()), '.',
                         member.getName().getValue());
    }
  }

  KJ_UNREACHABLE;
}